

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::requantize_int8_to_int8
               (Mat *src,Mat *dst,float scale_in,float scale_out,float *bias,int bias_data_size,
               int fusion_relu,Option *opt)

{
  Layer *pLVar1;
  Mat local_9b8;
  Mat weights [1];
  ParamDict pd;
  
  pLVar1 = create_layer(0x3f);
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,0,scale_in);
  ParamDict::set(&pd,1,scale_out);
  ParamDict::set(&pd,2,(uint)(bias != (float *)0x0));
  ParamDict::set(&pd,3,bias_data_size);
  ParamDict::set(&pd,4,fusion_relu);
  (*pLVar1->_vptr_Layer[2])(pLVar1,&pd);
  weights[0].elemsize._0_4_ = 0;
  weights[0]._20_8_ = 0;
  weights[0].data = (void *)0x0;
  weights[0].refcount._0_4_ = 0;
  weights[0].refcount._4_4_ = 0;
  local_9b8.refcount = (int *)0x0;
  local_9b8.elemsize = 4;
  local_9b8.allocator = (Allocator *)0x0;
  weights[0].allocator = (Allocator *)0x0;
  weights[0].dims = 0;
  weights[0].w = 0;
  weights[0].h = 0;
  weights[0].c = 0;
  weights[0].cstep = 0;
  local_9b8.h = 1;
  local_9b8.c = 1;
  local_9b8.cstep = (size_t)bias_data_size;
  local_9b8.data = bias;
  local_9b8.elempack = 1;
  local_9b8.dims = 1;
  local_9b8.w = bias_data_size;
  Mat::operator=(weights,&local_9b8);
  Mat::~Mat(&local_9b8);
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_9b8,weights);
  (*pLVar1->_vptr_Layer[3])(pLVar1,&local_9b8);
  ModelBin::~ModelBin((ModelBin *)&local_9b8);
  (*pLVar1->_vptr_Layer[4])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[7])(pLVar1,src,dst,opt);
  (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[1])(pLVar1);
  Mat::~Mat(weights);
  ParamDict::~ParamDict(&pd);
  return;
}

Assistant:

void requantize_int8_to_int8(const Mat& src, Mat& dst, float scale_in, float scale_out, const float* bias, int bias_data_size, int fusion_relu, const Option& opt)
{
    Layer* requantize = create_layer(LayerType::Requantize);

    ParamDict pd;
    pd.set(0, scale_in);
    pd.set(1, scale_out);
    pd.set(2, bias ? 1 : 0);
    pd.set(3, bias_data_size);
    pd.set(4, fusion_relu);

    requantize->load_param(pd);

    Mat weights[1];
    weights[0] = Mat(bias_data_size, (void*)bias);

    requantize->load_model(ModelBinFromMatArray(weights));

    requantize->create_pipeline(opt);

    requantize->forward(src, dst, opt);

    requantize->destroy_pipeline(opt);

    delete requantize;
}